

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O2

void checkOptions(void)

{
  char *__ptr;
  size_t sStack_10;
  
  if (*booleanOptions == 0) {
    if (booleanOptions[1] == 0) goto LAB_00101b1c;
    if (0 < *intOptions) {
      if (*stringOptions == (char *)0x0) {
        return;
      }
      __ptr = 
      "You have specified -unsat and -m, but no model can be created for an unsatisfiable instance\n"
      ;
      sStack_10 = 0x5c;
      goto LAB_00101b59;
    }
  }
  else {
    if (booleanOptions[1] != 0) {
LAB_00101b1c:
      __ptr = "You must specify either -sat or -unsat\n";
      sStack_10 = 0x27;
      goto LAB_00101b59;
    }
    if (0 < *intOptions) {
      return;
    }
  }
  __ptr = "You must specify num-of-variables to be at least 1\n";
  sStack_10 = 0x33;
LAB_00101b59:
  fwrite(__ptr,sStack_10,1,_stderr);
  printUsage();
  next = next * 0x41c64e6d + 0x3039;
  return;
}

Assistant:

void checkOptions()
{
    if ( (booleanOptions[SAT] && booleanOptions[UNSAT])
        || (!booleanOptions[SAT] && !booleanOptions[UNSAT])
    )
    {
        fprintf (stderr, "You must specify either -sat or -unsat\n");
        printUsage();
    }

    if (intOptions[NUM_VARIABLES] <= 0)
    {
        fprintf (stderr, "You must specify num-of-variables to be at least 1\n");
        printUsage();
    }

    if (booleanOptions[UNSAT] && stringOptions[MODEL] != NULL)
    {
        fprintf (stderr, "You have specified -unsat and -m, but no model can be created for an unsatisfiable instance\n");
        printUsage();
    }
}